

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffer.cpp
# Opt level: O0

void __thiscall char_buffer_move_Test::char_buffer_move_Test(char_buffer_move_Test *this)

{
  char_buffer_move_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__char_buffer_move_Test_00365510;
  return;
}

Assistant:

TEST(char_buffer, move)
{
    // If these change, this test may need to be updated to match
    ASSERT_EQ(16, ST_MAX_SSO_LENGTH);
    ASSERT_EQ(48, ST_MAX_SSO_SIZE);

    ST::char_buffer cb1("Test", 4);
    ST::wchar_buffer wcb1(L"Test", 4);

    ST::char_buffer dest(std::move(cb1));
    EXPECT_EQ(0, T_strcmp(dest.data(), "Test"));
    EXPECT_EQ(4U, dest.size());
    ST::wchar_buffer wdest(std::move(wcb1));
    EXPECT_EQ(0, T_strcmp(wdest.data(), L"Test"));
    EXPECT_EQ(4U, wdest.size());

    ST::char_buffer cb2("operator=", 9);
    ST::wchar_buffer wcb2(L"operator=", 9);

    dest = std::move(cb2);
    EXPECT_EQ(0, T_strcmp(dest.data(), "operator="));
    EXPECT_EQ(9U, dest.size());
    wdest = std::move(wcb2);
    EXPECT_EQ(0, T_strcmp(wdest.data(), L"operator="));
    EXPECT_EQ(9U, wdest.size());

    ST::char_buffer cb3("0123456789abcdefghij", 20);
    ST::wchar_buffer wcb3(L"0123456789abcdefghij", 20);

    ST::char_buffer dest2(std::move(cb3));
    EXPECT_EQ(0, T_strcmp(dest2.data(), "0123456789abcdefghij"));
    EXPECT_EQ(20U, dest2.size());
    ST::wchar_buffer wdest2(std::move(wcb3));
    EXPECT_EQ(0, T_strcmp(wdest2.data(), L"0123456789abcdefghij"));
    EXPECT_EQ(20U, wdest2.size());

    ST::char_buffer cb4("9876543210zyxwvutsrqponm", 24);
    ST::wchar_buffer wcb4(L"9876543210zyxwvutsrqponm", 24);

    dest2 = std::move(cb4);
    EXPECT_EQ(0, T_strcmp(dest2.data(), "9876543210zyxwvutsrqponm"));
    EXPECT_EQ(24U, dest2.size());
    wdest2 = std::move(wcb4);
    EXPECT_EQ(0, T_strcmp(wdest2.data(), L"9876543210zyxwvutsrqponm"));
    EXPECT_EQ(24U, wdest2.size());
}